

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeViewport(ImGuiViewportP *viewport)

{
  uint uVar1;
  bool bVar2;
  ImDrawList **ppIVar3;
  void *ptr_id;
  char *pcVar4;
  char *pcVar5;
  int draw_list_i;
  int i;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  int layer_i;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  ImVector<ImDrawList_*> *this;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  SetNextItemOpen(true,2);
  ptr_id = (void *)(ulong)(viewport->super_ImGuiViewport).ID;
  if (viewport->Window == (ImGuiWindow *)0x0) {
    pcVar5 = "N/A";
  }
  else {
    pcVar5 = viewport->Window->Name;
  }
  bVar2 = TreeNode(ptr_id,"Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"",
                   (ulong)*(uint *)&(viewport->super_ImGuiViewport).field_0x5c,ptr_id,
                   (ulong)(viewport->super_ImGuiViewport).ParentViewportId,pcVar5);
  if (bVar2) {
    uVar1 = (viewport->super_ImGuiViewport).Flags;
    BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%"
               ,(double)(viewport->super_ImGuiViewport).Pos.x,
               (double)(viewport->super_ImGuiViewport).Pos.y,
               (double)(viewport->super_ImGuiViewport).Size.x,
               (double)(viewport->super_ImGuiViewport).Size.y,(double)(viewport->WorkOffsetMin).x,
               (double)(viewport->WorkOffsetMin).y,(double)(viewport->WorkOffsetMax).x,
               (double)(viewport->WorkOffsetMax).y,(ulong)(uint)(int)viewport->PlatformMonitor);
    if (0 < *(int *)&(viewport->super_ImGuiViewport).field_0x5c) {
      SameLine(0.0,-1.0);
      bVar2 = SmallButton("Reset Pos");
      if (bVar2) {
        (viewport->super_ImGuiViewport).Pos.x = 200.0;
        (viewport->super_ImGuiViewport).Pos.y = 200.0;
        ImGuiViewportP::UpdateWorkRect(viewport);
        if (viewport->Window != (ImGuiWindow *)0x0) {
          viewport->Window->Pos = (viewport->super_ImGuiViewport).Pos;
        }
      }
    }
    pcVar5 = " IsPlatformMonitor";
    if ((uVar1 & 2) == 0) {
      pcVar5 = "";
    }
    pcVar4 = " OwnedByApp";
    if ((uVar1 & 4) == 0) {
      pcVar4 = "";
    }
    pcVar9 = " NoDecoration";
    if ((uVar1 & 8) == 0) {
      pcVar9 = "";
    }
    pcVar10 = " NoTaskBarIcon";
    if ((uVar1 & 0x10) == 0) {
      pcVar10 = "";
    }
    auVar18._0_4_ = -(uint)((uVar1 & 0x100) == 0);
    auVar18._4_4_ = -(uint)((uVar1 & 0x80) == 0);
    auVar18._8_4_ = -(uint)((uVar1 & 0x40) == 0);
    auVar18._12_4_ = -(uint)((uVar1 & 0x20) == 0);
    auVar17._0_4_ = -(uint)((uVar1 & 0x1000) == 0);
    auVar17._4_4_ = -(uint)((uVar1 & 0x800) == 0);
    auVar17._8_4_ = -(uint)((uVar1 & 0x400) == 0);
    auVar17._12_4_ = -(uint)((uVar1 & 0x200) == 0);
    auVar18 = packssdw(auVar17,auVar18);
    auVar18 = packsswb(auVar18,auVar18);
    pcVar7 = " NoFocusOnAppearing";
    if ((auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar7 = "";
    }
    pcVar8 = " NoFocusOnClick";
    if ((auVar18 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar8 = "";
    }
    pcVar15 = " NoInputs";
    if ((auVar18 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar15 = "";
    }
    pcVar16 = " NoRendererClear";
    if ((auVar18 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar16 = "";
    }
    pcVar14 = " TopMost";
    if ((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar14 = "";
    }
    pcVar6 = " Minimized";
    if ((auVar18 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar6 = "";
    }
    pcVar12 = " NoAutoMerge";
    if ((auVar18 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar12 = "";
    }
    pcVar11 = " CanHostOtherWindows";
    if ((auVar18 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar11 = "";
    }
    BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s%s%s%s%s%s",
               (ulong)(uint)(viewport->super_ImGuiViewport).Flags,pcVar5,pcVar4,pcVar9,pcVar10,
               pcVar7,pcVar8,pcVar15,pcVar16,pcVar14,pcVar6,pcVar12,pcVar11);
    for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
      this = (viewport->DrawDataBuilder).Layers + lVar13;
      for (i = 0; i < this->Size; i = i + 1) {
        ppIVar3 = ImVector<ImDrawList_*>::operator[](this,i);
        DebugNodeDrawList((ImGuiWindow *)0x0,viewport,*ppIVar3,"DrawList");
      }
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeViewport(ImGuiViewportP* viewport)
{
    SetNextItemOpen(true, ImGuiCond_Once);
    if (TreeNode((void*)(intptr_t)viewport->ID, "Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"", viewport->Idx, viewport->ID, viewport->ParentViewportId, viewport->Window ? viewport->Window->Name : "N/A"))
    {
        ImGuiWindowFlags flags = viewport->Flags;
        BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%",
            viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
            viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y,
            viewport->PlatformMonitor, viewport->DpiScale * 100.0f);
        if (viewport->Idx > 0) { SameLine(); if (SmallButton("Reset Pos")) { viewport->Pos = ImVec2(200, 200); viewport->UpdateWorkRect(); if (viewport->Window) viewport->Window->Pos = viewport->Pos; } }
        BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s%s%s%s%s%s", viewport->Flags,
            //(flags & ImGuiViewportFlags_IsPlatformWindow) ? " IsPlatformWindow" : "", // Omitting because it is the standard
            (flags & ImGuiViewportFlags_IsPlatformMonitor) ? " IsPlatformMonitor" : "",
            (flags & ImGuiViewportFlags_OwnedByApp) ? " OwnedByApp" : "",
            (flags & ImGuiViewportFlags_NoDecoration) ? " NoDecoration" : "",
            (flags & ImGuiViewportFlags_NoTaskBarIcon) ? " NoTaskBarIcon" : "",
            (flags & ImGuiViewportFlags_NoFocusOnAppearing) ? " NoFocusOnAppearing" : "",
            (flags & ImGuiViewportFlags_NoFocusOnClick) ? " NoFocusOnClick" : "",
            (flags & ImGuiViewportFlags_NoInputs) ? " NoInputs" : "",
            (flags & ImGuiViewportFlags_NoRendererClear) ? " NoRendererClear" : "",
            (flags & ImGuiViewportFlags_TopMost) ? " TopMost" : "",
            (flags & ImGuiViewportFlags_Minimized) ? " Minimized" : "",
            (flags & ImGuiViewportFlags_NoAutoMerge) ? " NoAutoMerge" : "",
            (flags & ImGuiViewportFlags_CanHostOtherWindows) ? " CanHostOtherWindows" : "");
        for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
            for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                DebugNodeDrawList(NULL, viewport, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        TreePop();
    }
}